

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int rd_contents(archive_read *a,void **buff,size_t *size,size_t *used,uint64_t remaining)

{
  int iVar1;
  uchar *local_48;
  ssize_t bytes;
  uchar *b;
  uint64_t remaining_local;
  size_t *used_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  b = (uchar *)remaining;
  remaining_local = (uint64_t)used;
  used_local = size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  bytes = (ssize_t)__archive_read_ahead(a,1,(ssize_t *)&local_48);
  if ((long)local_48 < 0) {
    a_local._4_4_ = (int)local_48;
  }
  else if (local_48 == (uchar *)0x0) {
    archive_set_error((archive *)buff_local,-1,"Truncated archive file");
    a_local._4_4_ = -0x1e;
  }
  else {
    if (b < local_48) {
      local_48 = b;
    }
    *(uchar **)remaining_local = local_48;
    iVar1 = decompress((archive_read *)buff_local,(void **)size_local,used_local,(void *)bytes,
                       (size_t *)remaining_local);
    if (iVar1 == 0) {
      checksum_update((archive_read *)buff_local,(void *)bytes,*(size_t *)remaining_local,
                      (void *)*size_local,*used_local);
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
rd_contents(struct archive_read *a, const void **buff, size_t *size,
    size_t *used, uint64_t remaining)
{
	const unsigned char *b;
	ssize_t bytes;

	/* Get whatever bytes are immediately available. */
	b = __archive_read_ahead(a, 1, &bytes);
	if (bytes < 0)
		return ((int)bytes);
	if (bytes == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Truncated archive file");
		return (ARCHIVE_FATAL);
	}
	if ((uint64_t)bytes > remaining)
		bytes = (ssize_t)remaining;

	/*
	 * Decompress contents of file.
	 */
	*used = bytes;
	if (decompress(a, buff, size, b, used) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Update checksum of a compressed data and a extracted data.
	 */
	checksum_update(a, b, *used, *buff, *size);

	return (ARCHIVE_OK);
}